

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O1

_Bool string_no_case_compare(char *one,char *two)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  __int32_t **pp_Var4;
  long lVar5;
  char cVar6;
  
  if (two != (char *)0x0 && one != (char *)0x0) {
    sVar2 = strlen(one);
    sVar3 = strlen(two);
    if (sVar2 == sVar3) {
      cVar6 = *one;
      if (cVar6 == '\0') {
        return true;
      }
      lVar5 = 0;
      while( true ) {
        cVar1 = two[lVar5];
        if ((long)cVar1 == 0) {
          return true;
        }
        pp_Var4 = __ctype_tolower_loc();
        if ((*pp_Var4)[cVar6] != (*pp_Var4)[cVar1]) break;
        cVar6 = one[lVar5 + 1];
        lVar5 = lVar5 + 1;
        if (cVar6 == '\0') {
          return true;
        }
      }
      return false;
    }
  }
  return false;
}

Assistant:

bool string_no_case_compare(const char *one, const char *two)
{
        if (one == NULL || two == NULL || (strlen(one) != strlen(two))) {
                return false;
        }

        char ch_one = '\0';
        char ch_two = '\0';

        while ((ch_one = *one) != '\0' && (ch_two = *two) != '\0') {
                if (tolower(ch_one) != tolower(ch_two)) {
                        return false;
                }

                ++one;
                ++two;
        }

        return true;
}